

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O2

Matrix33 *
AML::eulerAngleRatesMatrix_YXY(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  undefined8 local_38;
  double local_30;
  double dStack_28;
  undefined8 local_20;
  double local_18;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dStack_28 = 1.0 / dVar4;
  local_18 = -dVar1 * dStack_28;
  local_58 = -dVar2 * dVar3 * dStack_28;
  dStack_50 = dVar4 * dStack_28;
  local_48 = dVar3 * dVar1 * dStack_28;
  dStack_40 = dVar4 * dVar1 * dStack_28;
  local_38 = 0;
  local_30 = dVar4 * dVar2 * dStack_28;
  dStack_28 = dVar2 * dStack_28;
  local_20 = 0;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_YXY(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cscTheta = 1.0 / sinTheta;

        double data[3][3] = { { -sinPhi * cosTheta * cscTheta, sinTheta * cscTheta, cosPhi * cosTheta * cscTheta },
                              { sinTheta * cosPhi * cscTheta, 0.0, sinTheta * sinPhi * cscTheta },
                              { sinPhi * cscTheta, 0.0, -cosPhi * cscTheta } };

        return Matrix33(data);
    }